

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gf.c
# Opt level: O3

gf gf_mul(gf in0,gf in1)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  undefined2 in_register_00000032;
  undefined2 in_register_0000003a;
  
  uVar3 = 0;
  if ((in1 & 1) != 0) {
    uVar3 = CONCAT22(in_register_0000003a,in0);
  }
  iVar1 = 1;
  do {
    uVar3 = uVar3 ^ (1 << ((byte)iVar1 & 0x1f) & CONCAT22(in_register_00000032,in1)) *
                    CONCAT22(in_register_0000003a,in0);
    iVar1 = iVar1 + 1;
  } while (iVar1 != 0xc);
  uVar3 = (uVar3 & 0x7fc000) >> 0xc ^ (uVar3 & 0x7fc000) >> 9 ^ uVar3;
  uVar2 = uVar3 & 0x3000;
  return (ushort)uVar3 & 0xfff ^ ((ushort)(uVar2 >> 0xc) | (ushort)(uVar2 >> 9));
}

Assistant:

gf gf_mul(gf in0, gf in1)
{
	int i;

	uint32_t tmp;
	uint32_t t0;
	uint32_t t1;
	uint32_t t;

	t0 = in0;
	t1 = in1;

	tmp = t0 * (t1 & 1);

	for (i = 1; i < GFBITS; i++)
		tmp ^= (t0 * (t1 & (1 << i)));

	t = tmp & 0x7FC000;
	tmp ^= t >> 9;
	tmp ^= t >> 12;

	t = tmp & 0x3000;
	tmp ^= t >> 9;
	tmp ^= t >> 12;

	return tmp & ((1 << GFBITS)-1);
}